

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

void __thiscall ON_MappingMeshInfo::GenerateDerivedData(ON_MappingMeshInfo *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_28;
  int sourceId_1;
  int fi_1;
  int sid;
  int nTotal;
  int local_14;
  int sourceId;
  int fi;
  ON_MappingMeshInfo *this_local;
  
  _sourceId = this;
  ON_SimpleArray<int>::Empty(&this->m_sourceIdFaceStart);
  ON_SimpleArray<int>::Empty(&this->m_sourceIdFaceCount);
  ON_SimpleArray<int>::Empty(&this->m_sourceIdFaceList);
  for (local_14 = 0; iVar2 = local_14, iVar1 = ON_SimpleArray<int>::Count(&this->m_faceSourceIds),
      iVar2 < iVar1; local_14 = local_14 + 1) {
    piVar3 = ON_SimpleArray<int>::operator[](&this->m_faceSourceIds,local_14);
    nTotal = *piVar3;
    if (-1 < nTotal) {
      while (iVar2 = ON_SimpleArray<int>::Count(&this->m_sourceIdFaceCount), iVar2 <= nTotal) {
        sid = 0;
        ON_SimpleArray<int>::Append(&this->m_sourceIdFaceCount,&sid);
      }
      piVar3 = ON_SimpleArray<int>::operator[](&this->m_sourceIdFaceCount,nTotal);
      *piVar3 = *piVar3 + 1;
    }
  }
  fi_1 = 0;
  for (sourceId_1 = 0; iVar2 = ON_SimpleArray<int>::Count(&this->m_sourceIdFaceCount),
      sourceId_1 < iVar2; sourceId_1 = sourceId_1 + 1) {
    ON_SimpleArray<int>::Append(&this->m_sourceIdFaceStart,&fi_1);
    piVar3 = ON_SimpleArray<int>::operator[](&this->m_sourceIdFaceCount,sourceId_1);
    fi_1 = *piVar3 + fi_1;
  }
  ON_SimpleArray<int>::SetCapacity(&this->m_sourceIdFaceList,(long)fi_1);
  ON_SimpleArray<int>::SetCount(&this->m_sourceIdFaceList,fi_1);
  ON_SimpleArray<int>::MemSet(&this->m_sourceIdFaceList,'\0');
  ON_SimpleArray<int>::MemSet(&this->m_sourceIdFaceCount,'\0');
  for (local_28 = 0; iVar2 = ON_SimpleArray<int>::Count(&this->m_faceSourceIds), local_28 < iVar2;
      local_28 = local_28 + 1) {
    piVar3 = ON_SimpleArray<int>::operator[](&this->m_faceSourceIds,local_28);
    iVar2 = *piVar3;
    if (-1 < iVar2) {
      piVar3 = ON_SimpleArray<int>::operator[](&this->m_sourceIdFaceStart,iVar2);
      iVar1 = *piVar3;
      piVar3 = ON_SimpleArray<int>::operator[](&this->m_sourceIdFaceCount,iVar2);
      piVar3 = ON_SimpleArray<int>::operator[](&this->m_sourceIdFaceList,iVar1 + *piVar3);
      *piVar3 = local_28;
      piVar3 = ON_SimpleArray<int>::operator[](&this->m_sourceIdFaceCount,iVar2);
      *piVar3 = *piVar3 + 1;
    }
  }
  return;
}

Assistant:

void ON_MappingMeshInfo::GenerateDerivedData()
{
  m_sourceIdFaceStart.Empty();
  m_sourceIdFaceCount.Empty();
  m_sourceIdFaceList.Empty();
  for (int fi = 0; fi < m_faceSourceIds.Count(); fi++)
  {
    const int sourceId = m_faceSourceIds[fi];
    if (sourceId >= 0)
    {
      while (m_sourceIdFaceCount.Count() <= sourceId)
      {
        m_sourceIdFaceCount.Append(0);
      }
      m_sourceIdFaceCount[sourceId]++;
    }
  }
  int nTotal = 0;
  for (int sid = 0; sid < m_sourceIdFaceCount.Count(); sid++)
  {
    m_sourceIdFaceStart.Append(nTotal);
    nTotal += m_sourceIdFaceCount[sid];
  }
  m_sourceIdFaceList.SetCapacity(nTotal);
  m_sourceIdFaceList.SetCount(nTotal);
  m_sourceIdFaceList.MemSet(0);
  m_sourceIdFaceCount.MemSet(0);
  for (int fi = 0; fi < m_faceSourceIds.Count(); fi++)
  {
    const int sourceId = m_faceSourceIds[fi];
    if (sourceId >= 0)
    {
      m_sourceIdFaceList[m_sourceIdFaceStart[sourceId] + m_sourceIdFaceCount[sourceId]] = fi;
      m_sourceIdFaceCount[sourceId]++;
    }
  }
}